

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  int iVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  ulong uVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 (*pauVar70) [16];
  ulong uVar71;
  ulong uVar72;
  GridSOA *pGVar73;
  long lVar74;
  uint uVar75;
  uint uVar76;
  undefined1 (*pauVar77) [16];
  ulong uVar78;
  char *pcVar79;
  ulong uVar80;
  Geometry *pGVar81;
  ulong uVar82;
  ulong uVar83;
  undefined4 uVar84;
  ulong unaff_R15;
  float fVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar88 [64];
  float fVar101;
  float fVar102;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar97 [32];
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar107;
  float fVar109;
  float fVar111;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar123;
  float fVar124;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar140;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  float fVar157;
  float fVar163;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar156;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar155 [64];
  float fVar164;
  float fVar173;
  undefined1 auVar165 [24];
  undefined1 auVar167 [32];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar174;
  undefined1 auVar168 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  float fVar179;
  float fVar184;
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar180 [16];
  float fVar178;
  undefined1 auVar181 [32];
  float fVar183;
  float fVar185;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar182 [64];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  float fVar198;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  undefined1 auVar199 [64];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar209 [64];
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int iStack_14e8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined1 (*local_1490) [16];
  ulong local_1488;
  undefined8 local_1480;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  char *local_1448;
  ulong local_1440;
  ulong local_1438;
  RTCFilterFunctionNArguments local_1430;
  undefined1 local_1400 [16];
  undefined1 auStack_13f0 [16];
  undefined1 local_13e0 [8];
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined1 local_13c0 [32];
  undefined1 local_1390 [16];
  undefined1 local_1380 [32];
  Geometry *local_1360;
  undefined1 auStack_1358 [24];
  undefined1 local_1340 [16];
  undefined1 auStack_1330 [16];
  undefined1 local_1320 [32];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined1 local_1220 [32];
  char **local_1200;
  undefined1 local_11e0 [32];
  float local_11c0 [4];
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0 [4];
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  RTCHitN local_10f0 [16];
  undefined1 local_10e0 [16];
  undefined1 local_10d0 [16];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float local_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined1 local_1090 [16];
  uint local_1080;
  uint uStack_107c;
  uint uStack_1078;
  uint uStack_1074;
  uint uStack_1070;
  uint uStack_106c;
  uint uStack_1068;
  uint uStack_1064;
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar134 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [24];
  undefined1 auVar152 [32];
  undefined1 auVar166 [32];
  
  pauVar77 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar84 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1270._4_4_ = uVar84;
  local_1270._0_4_ = uVar84;
  local_1270._8_4_ = uVar84;
  local_1270._12_4_ = uVar84;
  auVar143 = ZEXT1664(local_1270);
  uVar84 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1280._4_4_ = uVar84;
  local_1280._0_4_ = uVar84;
  local_1280._8_4_ = uVar84;
  local_1280._12_4_ = uVar84;
  auVar155 = ZEXT1664(local_1280);
  uVar84 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1290._4_4_ = uVar84;
  local_1290._0_4_ = uVar84;
  local_1290._8_4_ = uVar84;
  local_1290._12_4_ = uVar84;
  auVar168 = ZEXT1664(local_1290);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar125 = ZEXT416((uint)(fVar85 * 0.99999964));
  local_12a0 = vshufps_avx(auVar125,auVar125,0);
  auVar177 = ZEXT1664(local_12a0);
  auVar125 = ZEXT416((uint)(fVar1 * 0.99999964));
  local_12b0 = vshufps_avx(auVar125,auVar125,0);
  auVar182 = ZEXT1664(local_12b0);
  auVar125 = ZEXT416((uint)(fVar2 * 0.99999964));
  local_12c0 = vshufps_avx(auVar125,auVar125,0);
  auVar197 = ZEXT1664(local_12c0);
  auVar125 = ZEXT416((uint)(fVar85 * 1.0000004));
  local_12d0 = vshufps_avx(auVar125,auVar125,0);
  auVar199 = ZEXT1664(local_12d0);
  auVar125 = ZEXT416((uint)(fVar1 * 1.0000004));
  local_12e0 = vshufps_avx(auVar125,auVar125,0);
  auVar209 = ZEXT1664(local_12e0);
  auVar125 = ZEXT416((uint)(fVar2 * 1.0000004));
  local_12f0 = vshufps_avx(auVar125,auVar125,0);
  auVar229 = ZEXT1664(local_12f0);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar83 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar82 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1488 = uVar78 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  local_1390._4_4_ = iVar3;
  local_1390._0_4_ = iVar3;
  local_1390._8_4_ = iVar3;
  local_1390._12_4_ = iVar3;
  auVar139 = ZEXT1664(local_1390);
  iVar3 = (tray->tfar).field_0.i[k];
  auVar88 = ZEXT1664(CONCAT412(iVar3,CONCAT48(iVar3,CONCAT44(iVar3,iVar3))));
  local_1490 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  while (pauVar77 != (undefined1 (*) [16])&local_fa0) {
    pauVar70 = pauVar77 + -1;
    pauVar77 = pauVar77 + -1;
    if (*(float *)(*pauVar70 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar72 = *(ulong *)*pauVar77;
      do {
        if ((uVar72 & 8) == 0) {
          auVar125 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + uVar78),auVar143._0_16_);
          auVar95._0_4_ = auVar177._0_4_ * auVar125._0_4_;
          auVar95._4_4_ = auVar177._4_4_ * auVar125._4_4_;
          auVar95._8_4_ = auVar177._8_4_ * auVar125._8_4_;
          auVar95._12_4_ = auVar177._12_4_ * auVar125._12_4_;
          auVar125 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + uVar83),auVar155._0_16_);
          auVar141._0_4_ = auVar182._0_4_ * auVar125._0_4_;
          auVar141._4_4_ = auVar182._4_4_ * auVar125._4_4_;
          auVar141._8_4_ = auVar182._8_4_ * auVar125._8_4_;
          auVar141._12_4_ = auVar182._12_4_ * auVar125._12_4_;
          auVar125 = vmaxps_avx(auVar95,auVar141);
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + uVar82),auVar168._0_16_);
          auVar112._0_4_ = auVar197._0_4_ * auVar95._0_4_;
          auVar112._4_4_ = auVar197._4_4_ * auVar95._4_4_;
          auVar112._8_4_ = auVar197._8_4_ * auVar95._8_4_;
          auVar112._12_4_ = auVar197._12_4_ * auVar95._12_4_;
          auVar95 = vmaxps_avx(auVar112,auVar139._0_16_);
          local_1260 = vmaxps_avx(auVar125,auVar95);
          auVar125 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + local_1488),auVar143._0_16_);
          auVar180._0_4_ = auVar199._0_4_ * auVar125._0_4_;
          auVar180._4_4_ = auVar199._4_4_ * auVar125._4_4_;
          auVar180._8_4_ = auVar199._8_4_ * auVar125._8_4_;
          auVar180._12_4_ = auVar199._12_4_ * auVar125._12_4_;
          auVar125 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + (uVar83 ^ 0x10)),
                                auVar155._0_16_);
          auVar116._0_4_ = auVar209._0_4_ * auVar125._0_4_;
          auVar116._4_4_ = auVar209._4_4_ * auVar125._4_4_;
          auVar116._8_4_ = auVar209._8_4_ * auVar125._8_4_;
          auVar116._12_4_ = auVar209._12_4_ * auVar125._12_4_;
          auVar125 = vminps_avx(auVar180,auVar116);
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar72 + 0x20 + (uVar82 ^ 0x10)),
                               auVar168._0_16_);
          auVar117._0_4_ = auVar229._0_4_ * auVar95._0_4_;
          auVar117._4_4_ = auVar229._4_4_ * auVar95._4_4_;
          auVar117._8_4_ = auVar229._8_4_ * auVar95._8_4_;
          auVar117._12_4_ = auVar229._12_4_ * auVar95._12_4_;
          auVar95 = vminps_avx(auVar117,auVar88._0_16_);
          auVar125 = vminps_avx(auVar125,auVar95);
          auVar125 = vcmpps_avx(local_1260,auVar125,2);
          uVar84 = vmovmskps_avx(auVar125);
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar84);
        }
        if ((uVar72 & 8) == 0) {
          if (unaff_R15 == 0) {
            iStack_14e8 = 4;
          }
          else {
            uVar71 = uVar72 & 0xfffffffffffffff0;
            lVar74 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
              }
            }
            iStack_14e8 = 0;
            uVar72 = *(ulong *)(uVar71 + lVar74 * 8);
            uVar80 = unaff_R15 - 1 & unaff_R15;
            if (uVar80 != 0) {
              uVar5 = *(uint *)(local_1260 + lVar74 * 4);
              lVar74 = 0;
              if (uVar80 != 0) {
                for (; (uVar80 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                }
              }
              uVar8 = *(ulong *)(uVar71 + lVar74 * 8);
              uVar76 = *(uint *)(local_1260 + lVar74 * 4);
              uVar80 = uVar80 - 1 & uVar80;
              if (uVar80 == 0) {
                if (uVar5 < uVar76) {
                  *(ulong *)*pauVar77 = uVar8;
                  *(uint *)(*pauVar77 + 8) = uVar76;
                  pauVar77 = pauVar77 + 1;
                }
                else {
                  *(ulong *)*pauVar77 = uVar72;
                  *(uint *)(*pauVar77 + 8) = uVar5;
                  uVar72 = uVar8;
                  pauVar77 = pauVar77 + 1;
                }
              }
              else {
                auVar125._8_8_ = 0;
                auVar125._0_8_ = uVar72;
                auVar125 = vpunpcklqdq_avx(auVar125,ZEXT416(uVar5));
                auVar113._8_8_ = 0;
                auVar113._0_8_ = uVar8;
                auVar95 = vpunpcklqdq_avx(auVar113,ZEXT416(uVar76));
                lVar74 = 0;
                if (uVar80 != 0) {
                  for (; (uVar80 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                  }
                }
                auVar118._8_8_ = 0;
                auVar118._0_8_ = *(ulong *)(uVar71 + lVar74 * 8);
                auVar112 = vpunpcklqdq_avx(auVar118,ZEXT416(*(uint *)(local_1260 + lVar74 * 4)));
                auVar141 = vpcmpgtd_avx(auVar95,auVar125);
                uVar80 = uVar80 - 1 & uVar80;
                if (uVar80 == 0) {
                  auVar180 = vpshufd_avx(auVar141,0xaa);
                  auVar141 = vblendvps_avx(auVar95,auVar125,auVar180);
                  auVar125 = vblendvps_avx(auVar125,auVar95,auVar180);
                  auVar95 = vpcmpgtd_avx(auVar112,auVar141);
                  auVar180 = vpshufd_avx(auVar95,0xaa);
                  auVar95 = vblendvps_avx(auVar112,auVar141,auVar180);
                  auVar141 = vblendvps_avx(auVar141,auVar112,auVar180);
                  auVar112 = vpcmpgtd_avx(auVar141,auVar125);
                  auVar180 = vpshufd_avx(auVar112,0xaa);
                  auVar112 = vblendvps_avx(auVar141,auVar125,auVar180);
                  auVar125 = vblendvps_avx(auVar125,auVar141,auVar180);
                  *pauVar77 = auVar125;
                  pauVar77[1] = auVar112;
                  uVar72 = auVar95._0_8_;
                  pauVar77 = pauVar77 + 2;
                }
                else {
                  lVar74 = 0;
                  if (uVar80 != 0) {
                    for (; (uVar80 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
                    }
                  }
                  auVar128._8_8_ = 0;
                  auVar128._0_8_ = *(ulong *)(uVar71 + lVar74 * 8);
                  auVar116 = vpunpcklqdq_avx(auVar128,ZEXT416(*(uint *)(local_1260 + lVar74 * 4)));
                  auVar180 = vpshufd_avx(auVar141,0xaa);
                  auVar141 = vblendvps_avx(auVar95,auVar125,auVar180);
                  auVar125 = vblendvps_avx(auVar125,auVar95,auVar180);
                  auVar95 = vpcmpgtd_avx(auVar116,auVar112);
                  auVar180 = vpshufd_avx(auVar95,0xaa);
                  auVar95 = vblendvps_avx(auVar116,auVar112,auVar180);
                  auVar112 = vblendvps_avx(auVar112,auVar116,auVar180);
                  auVar180 = vpcmpgtd_avx(auVar112,auVar125);
                  auVar116 = vpshufd_avx(auVar180,0xaa);
                  auVar180 = vblendvps_avx(auVar112,auVar125,auVar116);
                  auVar125 = vblendvps_avx(auVar125,auVar112,auVar116);
                  auVar112 = vpcmpgtd_avx(auVar95,auVar141);
                  auVar116 = vpshufd_avx(auVar112,0xaa);
                  auVar112 = vblendvps_avx(auVar95,auVar141,auVar116);
                  auVar95 = vblendvps_avx(auVar141,auVar95,auVar116);
                  auVar141 = vpcmpgtd_avx(auVar180,auVar95);
                  auVar116 = vpshufd_avx(auVar141,0xaa);
                  auVar141 = vblendvps_avx(auVar180,auVar95,auVar116);
                  auVar95 = vblendvps_avx(auVar95,auVar180,auVar116);
                  *pauVar77 = auVar125;
                  pauVar77[1] = auVar95;
                  pauVar77[2] = auVar141;
                  auVar139 = ZEXT1664(local_1390);
                  uVar72 = auVar112._0_8_;
                  pauVar77 = pauVar77 + 3;
                }
              }
            }
          }
        }
        else {
          iStack_14e8 = 6;
        }
      } while (iStack_14e8 == 0);
      if (iStack_14e8 == 6) {
        if (((uint)uVar72 & 0xf) == 8) {
          pGVar73 = (pre->super_Precalculations).grid;
          uVar5 = pGVar73->width;
          local_1440 = (ulong)uVar5;
          uVar76 = pGVar73->height;
          local_1438 = (ulong)uVar76;
          uVar6 = pGVar73->gridOffset;
          uVar72 = uVar72 >> 4;
          lVar74 = uVar72 * 4 + (ulong)uVar6;
          auVar125 = *(undefined1 (*) [16])(pGVar73->data + local_1440 * 4 + lVar74 + -4);
          auVar95 = auVar125;
          if (2 < local_1438) {
            auVar95 = *(undefined1 (*) [16])
                       (pGVar73->data + local_1440 * 8 + uVar72 * 4 + (ulong)uVar6 + -4);
          }
          auVar141 = *(undefined1 (*) [16])(pGVar73->data + uVar72 * 4 + (ulong)uVar6 + -4);
          if (local_1440 == 2) {
            auVar141 = vshufps_avx(auVar141,auVar141,0x54);
            auVar125 = vshufps_avx(auVar125,auVar125,0x54);
            auVar95 = vshufps_avx(auVar95,auVar95,0x54);
          }
          uVar72 = (ulong)pGVar73->dim_offset;
          pcVar79 = pGVar73->data + uVar72 * 4 + lVar74 + -4;
          auVar112 = *(undefined1 (*) [16])(pcVar79 + local_1440 * 4);
          auVar180 = auVar112;
          if (2 < uVar76) {
            auVar180 = *(undefined1 (*) [16])(pcVar79 + local_1440 * 8);
          }
          auVar116 = *(undefined1 (*) [16])pcVar79;
          if (uVar5 == 2) {
            auVar116 = vshufps_avx(auVar116,auVar116,0x54);
            auVar112 = vshufps_avx(auVar112,auVar112,0x54);
            auVar180 = vshufps_avx(auVar180,auVar180,0x54);
          }
          pcVar79 = pGVar73->data + uVar72 * 8 + lVar74 + -4;
          auVar117 = *(undefined1 (*) [16])(pcVar79 + local_1440 * 4);
          auVar113 = auVar117;
          if (2 < uVar76) {
            auVar113 = *(undefined1 (*) [16])(pcVar79 + local_1440 * 8);
          }
          auVar149._16_16_ = auVar125;
          auVar149._0_16_ = auVar141;
          auVar86._16_16_ = auVar95;
          auVar86._0_16_ = auVar125;
          auVar87 = vunpcklps_avx(auVar149,auVar86);
          auVar149 = vshufps_avx(auVar149,auVar149,0xa5);
          auVar86 = vshufps_avx(auVar86,auVar86,0x94);
          auVar130._16_16_ = auVar112;
          auVar130._0_16_ = auVar116;
          auVar150._16_16_ = auVar180;
          auVar150._0_16_ = auVar112;
          auVar100 = vunpcklps_avx(auVar130,auVar150);
          auVar130 = vshufps_avx(auVar130,auVar130,0xa5);
          auVar150 = vshufps_avx(auVar150,auVar150,0x94);
          auVar125 = *(undefined1 (*) [16])pcVar79;
          if (uVar5 == 2) {
            auVar125 = vshufps_avx(auVar125,auVar125,0x54);
            auVar117 = vshufps_avx(auVar117,auVar117,0x54);
            auVar113 = vshufps_avx(auVar113,auVar113,0x54);
          }
          local_1448 = pGVar73->data + uVar72 * 0xc + lVar74 + -4;
          auVar151._16_16_ = auVar117;
          auVar151._0_16_ = auVar125;
          auVar135._16_16_ = auVar113;
          auVar135._0_16_ = auVar117;
          auVar30 = vunpcklps_avx(auVar151,auVar135);
          auVar25 = vshufps_avx(auVar151,auVar151,0xa5);
          auVar26 = vshufps_avx(auVar135,auVar135,0x94);
          uVar5 = pGVar73->_geomID;
          uVar76 = pGVar73->_primID;
          local_1200 = &local_1448;
          uVar84 = *(undefined4 *)(ray + k * 4);
          auVar136._4_4_ = uVar84;
          auVar136._0_4_ = uVar84;
          auVar136._8_4_ = uVar84;
          auVar136._12_4_ = uVar84;
          auVar136._16_4_ = uVar84;
          auVar136._20_4_ = uVar84;
          auVar136._24_4_ = uVar84;
          auVar136._28_4_ = uVar84;
          uVar84 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar175._4_4_ = uVar84;
          auVar175._0_4_ = uVar84;
          auVar175._8_4_ = uVar84;
          auVar175._12_4_ = uVar84;
          auVar175._16_4_ = uVar84;
          auVar175._20_4_ = uVar84;
          auVar175._24_4_ = uVar84;
          auVar175._28_4_ = uVar84;
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar181._4_4_ = uVar4;
          auVar181._0_4_ = uVar4;
          auVar181._8_4_ = uVar4;
          auVar181._12_4_ = uVar4;
          auVar181._16_4_ = uVar4;
          auVar181._20_4_ = uVar4;
          auVar181._24_4_ = uVar4;
          auVar181._28_4_ = uVar4;
          auVar87 = vsubps_avx(auVar87,auVar136);
          auVar100 = vsubps_avx(auVar100,auVar175);
          auVar30 = vsubps_avx(auVar30,auVar181);
          auVar149 = vsubps_avx(auVar149,auVar136);
          auVar130 = vsubps_avx(auVar130,auVar175);
          auVar25 = vsubps_avx(auVar25,auVar181);
          auVar86 = vsubps_avx(auVar86,auVar136);
          auVar150 = vsubps_avx(auVar150,auVar175);
          auVar27 = vsubps_avx(auVar26,auVar181);
          local_fc0 = vsubps_avx(auVar86,auVar87);
          local_fe0 = vsubps_avx(auVar150,auVar100);
          local_1000 = vsubps_avx(auVar27,auVar30);
          fVar1 = auVar100._0_4_;
          fVar85 = auVar150._0_4_ + fVar1;
          fVar11 = auVar100._4_4_;
          fVar89 = auVar150._4_4_ + fVar11;
          fVar103 = auVar100._8_4_;
          fVar90 = auVar150._8_4_ + fVar103;
          fVar109 = auVar100._12_4_;
          fVar91 = auVar150._12_4_ + fVar109;
          fVar15 = auVar100._16_4_;
          fVar92 = auVar150._16_4_ + fVar15;
          fVar18 = auVar100._20_4_;
          fVar93 = auVar150._20_4_ + fVar18;
          fVar21 = auVar100._24_4_;
          fVar94 = auVar150._24_4_ + fVar21;
          fVar2 = auVar30._0_4_;
          fVar144 = auVar27._0_4_ + fVar2;
          fVar12 = auVar30._4_4_;
          fVar156 = auVar27._4_4_ + fVar12;
          fVar105 = auVar30._8_4_;
          fVar158 = auVar27._8_4_ + fVar105;
          fVar110 = auVar30._12_4_;
          fVar159 = auVar27._12_4_ + fVar110;
          fVar16 = auVar30._16_4_;
          fVar160 = auVar27._16_4_ + fVar16;
          fVar19 = auVar30._20_4_;
          fVar161 = auVar27._20_4_ + fVar19;
          fVar22 = auVar30._24_4_;
          fVar162 = auVar27._24_4_ + fVar22;
          fVar145 = auVar30._28_4_;
          fVar163 = auVar27._28_4_ + fVar145;
          fVar101 = local_1000._0_4_;
          fVar102 = local_1000._4_4_;
          auVar28._4_4_ = fVar89 * fVar102;
          auVar28._0_4_ = fVar85 * fVar101;
          fVar104 = local_1000._8_4_;
          auVar28._8_4_ = fVar90 * fVar104;
          fVar106 = local_1000._12_4_;
          auVar28._12_4_ = fVar91 * fVar106;
          fVar108 = local_1000._16_4_;
          auVar28._16_4_ = fVar92 * fVar108;
          fVar111 = local_1000._20_4_;
          auVar28._20_4_ = fVar93 * fVar111;
          fVar24 = local_1000._24_4_;
          auVar28._24_4_ = fVar94 * fVar24;
          auVar28._28_4_ = auVar26._28_4_;
          fVar206 = local_fe0._0_4_;
          fVar210 = local_fe0._4_4_;
          auVar26._4_4_ = fVar210 * fVar156;
          auVar26._0_4_ = fVar206 * fVar144;
          fVar213 = local_fe0._8_4_;
          auVar26._8_4_ = fVar213 * fVar158;
          fVar216 = local_fe0._12_4_;
          auVar26._12_4_ = fVar216 * fVar159;
          fVar219 = local_fe0._16_4_;
          auVar26._16_4_ = fVar219 * fVar160;
          fVar222 = local_fe0._20_4_;
          auVar26._20_4_ = fVar222 * fVar161;
          fVar225 = local_fe0._24_4_;
          auVar26._24_4_ = fVar225 * fVar162;
          auVar26._28_4_ = uVar84;
          auVar26 = vsubps_avx(auVar26,auVar28);
          fVar10 = auVar87._0_4_;
          fVar164 = auVar86._0_4_ + fVar10;
          fVar13 = auVar87._4_4_;
          fVar169 = auVar86._4_4_ + fVar13;
          fVar107 = auVar87._8_4_;
          fVar170 = auVar86._8_4_ + fVar107;
          fVar14 = auVar87._12_4_;
          fVar171 = auVar86._12_4_ + fVar14;
          fVar17 = auVar87._16_4_;
          fVar172 = auVar86._16_4_ + fVar17;
          fVar20 = auVar87._20_4_;
          fVar173 = auVar86._20_4_ + fVar20;
          fVar23 = auVar87._24_4_;
          fVar174 = auVar86._24_4_ + fVar23;
          fVar140 = auVar86._28_4_;
          fVar178 = local_fc0._0_4_;
          fVar183 = local_fc0._4_4_;
          auVar29._4_4_ = fVar183 * fVar156;
          auVar29._0_4_ = fVar178 * fVar144;
          fVar185 = local_fc0._8_4_;
          auVar29._8_4_ = fVar185 * fVar158;
          fVar187 = local_fc0._12_4_;
          auVar29._12_4_ = fVar187 * fVar159;
          fVar189 = local_fc0._16_4_;
          auVar29._16_4_ = fVar189 * fVar160;
          fVar191 = local_fc0._20_4_;
          auVar29._20_4_ = fVar191 * fVar161;
          fVar193 = local_fc0._24_4_;
          auVar29._24_4_ = fVar193 * fVar162;
          auVar29._28_4_ = fVar163;
          auVar135 = local_1000;
          auVar31._4_4_ = fVar169 * fVar102;
          auVar31._0_4_ = fVar164 * fVar101;
          auVar31._8_4_ = fVar170 * fVar104;
          auVar31._12_4_ = fVar171 * fVar106;
          auVar31._16_4_ = fVar172 * fVar108;
          auVar31._20_4_ = fVar173 * fVar111;
          auVar31._24_4_ = fVar174 * fVar24;
          auVar31._28_4_ = uVar84;
          auVar28 = vsubps_avx(auVar31,auVar29);
          auVar32._4_4_ = fVar169 * fVar210;
          auVar32._0_4_ = fVar164 * fVar206;
          auVar32._8_4_ = fVar170 * fVar213;
          auVar32._12_4_ = fVar171 * fVar216;
          auVar32._16_4_ = fVar172 * fVar219;
          auVar32._20_4_ = fVar173 * fVar222;
          auVar32._24_4_ = fVar174 * fVar225;
          auVar32._28_4_ = fVar163;
          auVar33._4_4_ = fVar183 * fVar89;
          auVar33._0_4_ = fVar178 * fVar85;
          auVar33._8_4_ = fVar185 * fVar90;
          auVar33._12_4_ = fVar187 * fVar91;
          auVar33._16_4_ = fVar189 * fVar92;
          auVar33._20_4_ = fVar191 * fVar93;
          auVar33._24_4_ = fVar193 * fVar94;
          auVar33._28_4_ = auVar150._28_4_ + auVar100._28_4_;
          auVar29 = vsubps_avx(auVar33,auVar32);
          local_1480._4_4_ = *(float *)(ray + k * 4 + 0x50);
          fVar85 = *(float *)(ray + k * 4 + 0x60);
          local_13c0._4_4_ = fVar85;
          local_13c0._0_4_ = fVar85;
          local_13c0._8_4_ = fVar85;
          local_13c0._12_4_ = fVar85;
          local_13c0._16_4_ = fVar85;
          local_13c0._20_4_ = fVar85;
          local_13c0._24_4_ = fVar85;
          local_13c0._28_4_ = fVar85;
          local_13e0._4_4_ = *(undefined4 *)(ray + k * 4 + 0x40);
          local_1260._0_4_ =
               auVar26._0_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._0_4_ + auVar29._0_4_ * fVar85;
          local_1260._4_4_ =
               auVar26._4_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._4_4_ + auVar29._4_4_ * fVar85;
          local_1260._8_4_ =
               auVar26._8_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._8_4_ + auVar29._8_4_ * fVar85;
          local_1260._12_4_ =
               auVar26._12_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._12_4_ + auVar29._12_4_ * fVar85;
          auVar165._16_4_ =
               auVar26._16_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._16_4_ + auVar29._16_4_ * fVar85;
          auVar165._0_16_ = local_1260;
          auVar165._20_4_ =
               auVar26._20_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._20_4_ + auVar29._20_4_ * fVar85;
          auVar166._24_4_ =
               auVar26._24_4_ * (float)local_13e0._4_4_ +
               local_1480._4_4_ * auVar28._24_4_ + auVar29._24_4_ * fVar85;
          auVar166._0_24_ = auVar165;
          auVar166._28_4_ = auVar26._28_4_ + auVar28._28_4_ + auVar29._28_4_;
          local_1020 = vsubps_avx(auVar100,auVar130);
          auVar26 = vsubps_avx(auVar30,auVar25);
          fVar90 = fVar1 + auVar130._0_4_;
          fVar91 = fVar11 + auVar130._4_4_;
          fVar92 = fVar103 + auVar130._8_4_;
          fVar93 = fVar109 + auVar130._12_4_;
          fVar94 = fVar15 + auVar130._16_4_;
          fVar144 = fVar18 + auVar130._20_4_;
          fVar156 = fVar21 + auVar130._24_4_;
          fVar89 = auVar130._28_4_;
          fVar158 = auVar25._0_4_ + fVar2;
          fVar159 = auVar25._4_4_ + fVar12;
          fVar160 = auVar25._8_4_ + fVar105;
          fVar161 = auVar25._12_4_ + fVar110;
          fVar162 = auVar25._16_4_ + fVar16;
          fVar163 = auVar25._20_4_ + fVar19;
          fVar164 = auVar25._24_4_ + fVar22;
          fVar228 = auVar26._0_4_;
          fVar230 = auVar26._4_4_;
          auVar30._4_4_ = fVar230 * fVar91;
          auVar30._0_4_ = fVar228 * fVar90;
          fVar231 = auVar26._8_4_;
          auVar30._8_4_ = fVar231 * fVar92;
          fVar232 = auVar26._12_4_;
          auVar30._12_4_ = fVar232 * fVar93;
          fVar233 = auVar26._16_4_;
          auVar30._16_4_ = fVar233 * fVar94;
          fVar234 = auVar26._20_4_;
          auVar30._20_4_ = fVar234 * fVar144;
          fVar235 = auVar26._24_4_;
          auVar30._24_4_ = fVar235 * fVar156;
          auVar30._28_4_ = auVar28._28_4_;
          fVar207 = local_1020._0_4_;
          fVar211 = local_1020._4_4_;
          auVar34._4_4_ = fVar211 * fVar159;
          auVar34._0_4_ = fVar207 * fVar158;
          fVar214 = local_1020._8_4_;
          auVar34._8_4_ = fVar214 * fVar160;
          fVar217 = local_1020._12_4_;
          auVar34._12_4_ = fVar217 * fVar161;
          fVar220 = local_1020._16_4_;
          auVar34._16_4_ = fVar220 * fVar162;
          fVar223 = local_1020._20_4_;
          auVar34._20_4_ = fVar223 * fVar163;
          fVar226 = local_1020._24_4_;
          auVar34._24_4_ = fVar226 * fVar164;
          auVar34._28_4_ = fVar145;
          auVar26 = vsubps_avx(auVar34,auVar30);
          auVar30 = vsubps_avx(auVar87,auVar149);
          fVar198 = auVar30._0_4_;
          fVar200 = auVar30._4_4_;
          auVar35._4_4_ = fVar200 * fVar159;
          auVar35._0_4_ = fVar198 * fVar158;
          fVar201 = auVar30._8_4_;
          auVar35._8_4_ = fVar201 * fVar160;
          fVar202 = auVar30._12_4_;
          auVar35._12_4_ = fVar202 * fVar161;
          fVar203 = auVar30._16_4_;
          auVar35._16_4_ = fVar203 * fVar162;
          fVar204 = auVar30._20_4_;
          auVar35._20_4_ = fVar204 * fVar163;
          fVar205 = auVar30._24_4_;
          auVar35._24_4_ = fVar205 * fVar164;
          auVar35._28_4_ = auVar25._28_4_ + fVar145;
          fVar145 = auVar149._0_4_ + fVar10;
          fVar158 = auVar149._4_4_ + fVar13;
          fVar159 = auVar149._8_4_ + fVar107;
          fVar160 = auVar149._12_4_ + fVar14;
          fVar161 = auVar149._16_4_ + fVar17;
          fVar162 = auVar149._20_4_ + fVar20;
          fVar163 = auVar149._24_4_ + fVar23;
          fVar195 = auVar149._28_4_;
          auVar36._4_4_ = fVar158 * fVar230;
          auVar36._0_4_ = fVar145 * fVar228;
          auVar36._8_4_ = fVar159 * fVar231;
          auVar36._12_4_ = fVar160 * fVar232;
          auVar36._16_4_ = fVar161 * fVar233;
          auVar36._20_4_ = fVar162 * fVar234;
          auVar36._24_4_ = fVar163 * fVar235;
          auVar36._28_4_ = fVar195;
          auVar30 = vsubps_avx(auVar36,auVar35);
          auVar37._4_4_ = fVar158 * fVar211;
          auVar37._0_4_ = fVar145 * fVar207;
          auVar37._8_4_ = fVar159 * fVar214;
          auVar37._12_4_ = fVar160 * fVar217;
          auVar37._16_4_ = fVar161 * fVar220;
          auVar37._20_4_ = fVar162 * fVar223;
          auVar37._24_4_ = fVar163 * fVar226;
          auVar37._28_4_ = fVar195 + auVar87._28_4_;
          auVar38._4_4_ = fVar200 * fVar91;
          auVar38._0_4_ = fVar198 * fVar90;
          auVar38._8_4_ = fVar201 * fVar92;
          auVar38._12_4_ = fVar202 * fVar93;
          auVar38._16_4_ = fVar203 * fVar94;
          auVar38._20_4_ = fVar204 * fVar144;
          auVar38._24_4_ = fVar205 * fVar156;
          auVar38._28_4_ = auVar100._28_4_ + fVar89;
          auVar28 = vsubps_avx(auVar38,auVar37);
          fVar146 = (float)local_13e0._4_4_ * auVar26._0_4_ +
                    auVar28._0_4_ * fVar85 + local_1480._4_4_ * auVar30._0_4_;
          fVar157 = (float)local_13e0._4_4_ * auVar26._4_4_ +
                    auVar28._4_4_ * fVar85 + local_1480._4_4_ * auVar30._4_4_;
          auVar147._0_8_ = CONCAT44(fVar157,fVar146);
          auVar147._8_4_ =
               (float)local_13e0._4_4_ * auVar26._8_4_ +
               auVar28._8_4_ * fVar85 + local_1480._4_4_ * auVar30._8_4_;
          auVar147._12_4_ =
               (float)local_13e0._4_4_ * auVar26._12_4_ +
               auVar28._12_4_ * fVar85 + local_1480._4_4_ * auVar30._12_4_;
          auVar148._16_4_ =
               (float)local_13e0._4_4_ * auVar26._16_4_ +
               auVar28._16_4_ * fVar85 + local_1480._4_4_ * auVar30._16_4_;
          auVar148._0_16_ = auVar147;
          auVar148._20_4_ =
               (float)local_13e0._4_4_ * auVar26._20_4_ +
               auVar28._20_4_ * fVar85 + local_1480._4_4_ * auVar30._20_4_;
          auVar152._24_4_ =
               (float)local_13e0._4_4_ * auVar26._24_4_ +
               auVar28._24_4_ * fVar85 + local_1480._4_4_ * auVar30._24_4_;
          auVar152._0_24_ = auVar148;
          auVar152._28_4_ = auVar30._28_4_ + auVar28._28_4_ + auVar30._28_4_;
          local_1040 = auVar152;
          auVar30 = local_1040;
          auVar26 = vsubps_avx(auVar149,auVar86);
          fVar144 = auVar149._0_4_ + auVar86._0_4_;
          fVar156 = auVar149._4_4_ + auVar86._4_4_;
          fVar158 = auVar149._8_4_ + auVar86._8_4_;
          fVar159 = auVar149._12_4_ + auVar86._12_4_;
          fVar160 = auVar149._16_4_ + auVar86._16_4_;
          fVar161 = auVar149._20_4_ + auVar86._20_4_;
          fVar162 = auVar149._24_4_ + auVar86._24_4_;
          auVar149 = vsubps_avx(auVar130,auVar150);
          fVar163 = auVar130._0_4_ + auVar150._0_4_;
          fVar164 = auVar130._4_4_ + auVar150._4_4_;
          fVar169 = auVar130._8_4_ + auVar150._8_4_;
          fVar170 = auVar130._12_4_ + auVar150._12_4_;
          fVar171 = auVar130._16_4_ + auVar150._16_4_;
          fVar172 = auVar130._20_4_ + auVar150._20_4_;
          fVar173 = auVar130._24_4_ + auVar150._24_4_;
          fVar174 = fVar89 + auVar150._28_4_;
          auVar86 = vsubps_avx(auVar25,auVar27);
          fVar90 = auVar25._0_4_ + auVar27._0_4_;
          fVar91 = auVar25._4_4_ + auVar27._4_4_;
          fVar92 = auVar25._8_4_ + auVar27._8_4_;
          fVar93 = auVar25._12_4_ + auVar27._12_4_;
          fVar94 = auVar25._16_4_ + auVar27._16_4_;
          fVar123 = auVar25._20_4_ + auVar27._20_4_;
          fVar124 = auVar25._24_4_ + auVar27._24_4_;
          fVar208 = auVar86._0_4_;
          fVar212 = auVar86._4_4_;
          auVar39._4_4_ = fVar212 * fVar164;
          auVar39._0_4_ = fVar208 * fVar163;
          fVar215 = auVar86._8_4_;
          auVar39._8_4_ = fVar215 * fVar169;
          fVar218 = auVar86._12_4_;
          auVar39._12_4_ = fVar218 * fVar170;
          fVar221 = auVar86._16_4_;
          auVar39._16_4_ = fVar221 * fVar171;
          fVar224 = auVar86._20_4_;
          auVar39._20_4_ = fVar224 * fVar172;
          fVar227 = auVar86._24_4_;
          auVar39._24_4_ = fVar227 * fVar173;
          auVar39._28_4_ = fVar89;
          fVar179 = auVar149._0_4_;
          fVar184 = auVar149._4_4_;
          auVar40._4_4_ = fVar184 * fVar91;
          auVar40._0_4_ = fVar179 * fVar90;
          fVar186 = auVar149._8_4_;
          auVar40._8_4_ = fVar186 * fVar92;
          fVar188 = auVar149._12_4_;
          auVar40._12_4_ = fVar188 * fVar93;
          fVar190 = auVar149._16_4_;
          auVar40._16_4_ = fVar190 * fVar94;
          fVar192 = auVar149._20_4_;
          auVar40._20_4_ = fVar192 * fVar123;
          fVar194 = auVar149._24_4_;
          auVar40._24_4_ = fVar194 * fVar124;
          auVar40._28_4_ = fVar140;
          auVar149 = vsubps_avx(auVar40,auVar39);
          fVar145 = auVar26._0_4_;
          fVar89 = auVar26._4_4_;
          auVar41._4_4_ = fVar89 * fVar91;
          auVar41._0_4_ = fVar145 * fVar90;
          fVar90 = auVar26._8_4_;
          auVar41._8_4_ = fVar90 * fVar92;
          fVar91 = auVar26._12_4_;
          auVar41._12_4_ = fVar91 * fVar93;
          fVar92 = auVar26._16_4_;
          auVar41._16_4_ = fVar92 * fVar94;
          fVar93 = auVar26._20_4_;
          auVar41._20_4_ = fVar93 * fVar123;
          fVar94 = auVar26._24_4_;
          auVar41._24_4_ = fVar94 * fVar124;
          auVar41._28_4_ = auVar25._28_4_ + auVar27._28_4_;
          auVar25._4_4_ = fVar212 * fVar156;
          auVar25._0_4_ = fVar208 * fVar144;
          auVar25._8_4_ = fVar215 * fVar158;
          auVar25._12_4_ = fVar218 * fVar159;
          auVar25._16_4_ = fVar221 * fVar160;
          auVar25._20_4_ = fVar224 * fVar161;
          auVar25._24_4_ = fVar227 * fVar162;
          auVar25._28_4_ = fVar140;
          auVar86 = vsubps_avx(auVar25,auVar41);
          auVar27._4_4_ = fVar184 * fVar156;
          auVar27._0_4_ = fVar179 * fVar144;
          auVar27._8_4_ = fVar186 * fVar158;
          auVar27._12_4_ = fVar188 * fVar159;
          auVar27._16_4_ = fVar190 * fVar160;
          auVar27._20_4_ = fVar192 * fVar161;
          auVar27._24_4_ = fVar194 * fVar162;
          auVar27._28_4_ = fVar195 + fVar140;
          auVar42._4_4_ = fVar89 * fVar164;
          auVar42._0_4_ = fVar145 * fVar163;
          auVar42._8_4_ = fVar90 * fVar169;
          auVar42._12_4_ = fVar91 * fVar170;
          auVar42._16_4_ = fVar92 * fVar171;
          auVar42._20_4_ = fVar93 * fVar172;
          auVar42._24_4_ = fVar94 * fVar173;
          auVar42._28_4_ = fVar174;
          auVar130 = vsubps_avx(auVar42,auVar27);
          local_1480._0_4_ = local_1480._4_4_;
          fStack_1478 = local_1480._4_4_;
          fStack_1474 = local_1480._4_4_;
          fStack_1470 = local_1480._4_4_;
          fStack_146c = local_1480._4_4_;
          fStack_1468 = local_1480._4_4_;
          fStack_1464 = local_1480._4_4_;
          local_13e0._0_4_ = local_13e0._4_4_;
          fStack_13d8 = (float)local_13e0._4_4_;
          fStack_13d4 = (float)local_13e0._4_4_;
          fStack_13d0 = (float)local_13e0._4_4_;
          fStack_13cc = (float)local_13e0._4_4_;
          fStack_13c8 = (float)local_13e0._4_4_;
          fStack_13c4 = (float)local_13e0._4_4_;
          auVar97._0_4_ =
               (float)local_13e0._4_4_ * auVar149._0_4_ +
               auVar130._0_4_ * fVar85 + local_1480._4_4_ * auVar86._0_4_;
          auVar97._4_4_ =
               (float)local_13e0._4_4_ * auVar149._4_4_ +
               auVar130._4_4_ * fVar85 + local_1480._4_4_ * auVar86._4_4_;
          auVar97._8_4_ =
               (float)local_13e0._4_4_ * auVar149._8_4_ +
               auVar130._8_4_ * fVar85 + local_1480._4_4_ * auVar86._8_4_;
          auVar97._12_4_ =
               (float)local_13e0._4_4_ * auVar149._12_4_ +
               auVar130._12_4_ * fVar85 + local_1480._4_4_ * auVar86._12_4_;
          auVar97._16_4_ =
               (float)local_13e0._4_4_ * auVar149._16_4_ +
               auVar130._16_4_ * fVar85 + local_1480._4_4_ * auVar86._16_4_;
          auVar97._20_4_ =
               (float)local_13e0._4_4_ * auVar149._20_4_ +
               auVar130._20_4_ * fVar85 + local_1480._4_4_ * auVar86._20_4_;
          auVar97._24_4_ =
               (float)local_13e0._4_4_ * auVar149._24_4_ +
               auVar130._24_4_ * fVar85 + local_1480._4_4_ * auVar86._24_4_;
          auVar97._28_4_ = fVar174 + auVar130._28_4_ + fVar174;
          local_1060._0_4_ = auVar97._0_4_ + local_1260._0_4_ + fVar146;
          local_1060._4_4_ = auVar97._4_4_ + local_1260._4_4_ + fVar157;
          local_1060._8_4_ = auVar97._8_4_ + local_1260._8_4_ + auVar147._8_4_;
          local_1060._12_4_ = auVar97._12_4_ + local_1260._12_4_ + auVar147._12_4_;
          local_1060._16_4_ = auVar97._16_4_ + auVar165._16_4_ + auVar148._16_4_;
          local_1060._20_4_ = auVar97._20_4_ + auVar165._20_4_ + auVar148._20_4_;
          local_1060._24_4_ = auVar97._24_4_ + auVar166._24_4_ + auVar152._24_4_;
          local_1060._28_4_ = auVar97._28_4_ + auVar166._28_4_ + auVar152._28_4_;
          auVar114._8_4_ = 0x7fffffff;
          auVar114._0_8_ = 0x7fffffff7fffffff;
          auVar114._12_4_ = 0x7fffffff;
          auVar114._16_4_ = 0x7fffffff;
          auVar114._20_4_ = 0x7fffffff;
          auVar114._24_4_ = 0x7fffffff;
          auVar114._28_4_ = 0x7fffffff;
          auVar149 = vandps_avx(local_1060,auVar114);
          fVar144 = auVar149._0_4_ * 1.1920929e-07;
          fVar156 = auVar149._4_4_ * 1.1920929e-07;
          auVar43._4_4_ = fVar156;
          auVar43._0_4_ = fVar144;
          fVar158 = auVar149._8_4_ * 1.1920929e-07;
          auVar43._8_4_ = fVar158;
          fVar159 = auVar149._12_4_ * 1.1920929e-07;
          auVar43._12_4_ = fVar159;
          fVar160 = auVar149._16_4_ * 1.1920929e-07;
          auVar43._16_4_ = fVar160;
          fVar161 = auVar149._20_4_ * 1.1920929e-07;
          auVar43._20_4_ = fVar161;
          uVar6 = auVar149._28_4_;
          fVar162 = auVar149._24_4_ * 1.1920929e-07;
          auVar43._24_4_ = fVar162;
          auVar43._28_4_ = uVar6;
          auVar149 = vminps_avx(auVar166,auVar152);
          auVar149 = vminps_avx(auVar149,auVar97);
          auVar131._0_8_ = CONCAT44(fVar156,fVar144) ^ 0x8000000080000000;
          auVar131._8_4_ = -fVar158;
          auVar131._12_4_ = -fVar159;
          auVar131._16_4_ = -fVar160;
          auVar131._20_4_ = -fVar161;
          auVar131._24_4_ = -fVar162;
          auVar131._28_4_ = uVar6 ^ 0x80000000;
          auVar149 = vcmpps_avx(auVar149,auVar131,5);
          auVar130 = vmaxps_avx(auVar166,auVar152);
          auVar86 = vmaxps_avx(auVar130,auVar97);
          auVar86 = vcmpps_avx(auVar86,auVar43,2);
          auVar86 = vorps_avx(auVar149,auVar86);
          if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar86 >> 0x7f,0) != '\0') ||
                (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar86 >> 0xbf,0) != '\0') ||
              (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar86[0x1f] < '\0') {
            auVar44._4_4_ = fVar211 * fVar102;
            auVar44._0_4_ = fVar207 * fVar101;
            auVar44._8_4_ = fVar214 * fVar104;
            auVar44._12_4_ = fVar217 * fVar106;
            auVar44._16_4_ = fVar220 * fVar108;
            auVar44._20_4_ = fVar223 * fVar111;
            auVar44._24_4_ = fVar226 * fVar24;
            auVar44._28_4_ = uVar6;
            auVar45._4_4_ = fVar210 * fVar230;
            auVar45._0_4_ = fVar206 * fVar228;
            auVar45._8_4_ = fVar213 * fVar231;
            auVar45._12_4_ = fVar216 * fVar232;
            auVar45._16_4_ = fVar219 * fVar233;
            auVar45._20_4_ = fVar222 * fVar234;
            auVar45._24_4_ = fVar225 * fVar235;
            auVar45._28_4_ = auVar149._28_4_;
            auVar150 = vsubps_avx(auVar45,auVar44);
            auVar46._4_4_ = fVar184 * fVar230;
            auVar46._0_4_ = fVar179 * fVar228;
            auVar46._8_4_ = fVar186 * fVar231;
            auVar46._12_4_ = fVar188 * fVar232;
            auVar46._16_4_ = fVar190 * fVar233;
            auVar46._20_4_ = fVar192 * fVar234;
            auVar46._24_4_ = fVar194 * fVar235;
            auVar46._28_4_ = auVar130._28_4_;
            auVar47._4_4_ = fVar211 * fVar212;
            auVar47._0_4_ = fVar207 * fVar208;
            auVar47._8_4_ = fVar214 * fVar215;
            auVar47._12_4_ = fVar217 * fVar218;
            auVar47._16_4_ = fVar220 * fVar221;
            auVar47._20_4_ = fVar223 * fVar224;
            auVar47._24_4_ = fVar226 * fVar227;
            auVar47._28_4_ = fVar140;
            auVar25 = vsubps_avx(auVar47,auVar46);
            auVar153._8_4_ = 0x7fffffff;
            auVar153._0_8_ = 0x7fffffff7fffffff;
            auVar153._12_4_ = 0x7fffffff;
            auVar153._16_4_ = 0x7fffffff;
            auVar153._20_4_ = 0x7fffffff;
            auVar153._24_4_ = 0x7fffffff;
            auVar153._28_4_ = 0x7fffffff;
            auVar149 = vandps_avx(auVar153,auVar44);
            auVar130 = vandps_avx(auVar153,auVar46);
            auVar149 = vcmpps_avx(auVar149,auVar130,1);
            local_1160 = vblendvps_avx(auVar25,auVar150,auVar149);
            auVar48._4_4_ = fVar200 * fVar212;
            auVar48._0_4_ = fVar198 * fVar208;
            auVar48._8_4_ = fVar201 * fVar215;
            auVar48._12_4_ = fVar202 * fVar218;
            auVar48._16_4_ = fVar203 * fVar221;
            auVar48._20_4_ = fVar204 * fVar224;
            auVar48._24_4_ = fVar205 * fVar227;
            auVar48._28_4_ = auVar149._28_4_;
            auVar49._4_4_ = fVar200 * fVar102;
            auVar49._0_4_ = fVar198 * fVar101;
            auVar49._8_4_ = fVar201 * fVar104;
            auVar49._12_4_ = fVar202 * fVar106;
            auVar49._16_4_ = fVar203 * fVar108;
            auVar49._20_4_ = fVar204 * fVar111;
            auVar49._24_4_ = fVar205 * fVar24;
            auVar49._28_4_ = auVar150._28_4_;
            auVar50._4_4_ = fVar230 * fVar183;
            auVar50._0_4_ = fVar228 * fVar178;
            auVar50._8_4_ = fVar231 * fVar185;
            auVar50._12_4_ = fVar232 * fVar187;
            auVar50._16_4_ = fVar233 * fVar189;
            auVar50._20_4_ = fVar234 * fVar191;
            auVar50._24_4_ = fVar235 * fVar193;
            auVar50._28_4_ = local_1000._28_4_;
            auVar150 = vsubps_avx(auVar49,auVar50);
            auVar51._4_4_ = fVar230 * fVar89;
            auVar51._0_4_ = fVar228 * fVar145;
            auVar51._8_4_ = fVar231 * fVar90;
            auVar51._12_4_ = fVar232 * fVar91;
            auVar51._16_4_ = fVar233 * fVar92;
            auVar51._20_4_ = fVar234 * fVar93;
            auVar51._24_4_ = fVar235 * fVar94;
            auVar51._28_4_ = auVar130._28_4_;
            auVar25 = vsubps_avx(auVar51,auVar48);
            auVar149 = vandps_avx(auVar153,auVar50);
            auVar130 = vandps_avx(auVar153,auVar48);
            auVar130 = vcmpps_avx(auVar149,auVar130,1);
            local_1140 = vblendvps_avx(auVar25,auVar150,auVar130);
            auVar52._4_4_ = fVar211 * fVar89;
            auVar52._0_4_ = fVar207 * fVar145;
            auVar52._8_4_ = fVar214 * fVar90;
            auVar52._12_4_ = fVar217 * fVar91;
            auVar52._16_4_ = fVar220 * fVar92;
            auVar52._20_4_ = fVar223 * fVar93;
            auVar52._24_4_ = fVar226 * fVar94;
            auVar52._28_4_ = auVar26._28_4_;
            auVar53._4_4_ = fVar211 * fVar183;
            auVar53._0_4_ = fVar207 * fVar178;
            auVar53._8_4_ = fVar214 * fVar185;
            auVar53._12_4_ = fVar217 * fVar187;
            auVar53._16_4_ = fVar220 * fVar189;
            auVar53._20_4_ = fVar223 * fVar191;
            auVar53._24_4_ = fVar226 * fVar193;
            auVar53._28_4_ = auVar130._28_4_;
            auVar54._4_4_ = fVar200 * fVar210;
            auVar54._0_4_ = fVar198 * fVar206;
            auVar54._8_4_ = fVar201 * fVar213;
            auVar54._12_4_ = fVar202 * fVar216;
            auVar54._16_4_ = fVar203 * fVar219;
            auVar54._20_4_ = fVar204 * fVar222;
            auVar54._24_4_ = fVar205 * fVar225;
            auVar54._28_4_ = auVar150._28_4_;
            auVar55._4_4_ = fVar200 * fVar184;
            auVar55._0_4_ = fVar198 * fVar179;
            auVar55._8_4_ = fVar201 * fVar186;
            auVar55._12_4_ = fVar202 * fVar188;
            auVar55._16_4_ = fVar203 * fVar190;
            auVar55._20_4_ = fVar204 * fVar192;
            auVar55._24_4_ = fVar205 * fVar194;
            auVar55._28_4_ = auVar149._28_4_;
            auVar150 = vsubps_avx(auVar53,auVar54);
            auVar26 = vsubps_avx(auVar55,auVar52);
            auVar149 = vandps_avx(auVar153,auVar54);
            auVar130 = vandps_avx(auVar153,auVar52);
            auVar130 = vcmpps_avx(auVar149,auVar130,1);
            local_1120 = vblendvps_avx(auVar26,auVar150,auVar130);
            auVar125 = vpackssdw_avx(auVar86._0_16_,auVar86._16_16_);
            fVar145 = auVar149._28_4_;
            fVar89 = local_1160._0_4_ * (float)local_13e0._4_4_ +
                     local_1120._0_4_ * fVar85 + local_1140._0_4_ * local_1480._4_4_;
            fVar101 = local_1160._4_4_ * (float)local_13e0._4_4_ +
                      local_1120._4_4_ * fVar85 + local_1140._4_4_ * local_1480._4_4_;
            fVar102 = local_1160._8_4_ * (float)local_13e0._4_4_ +
                      local_1120._8_4_ * fVar85 + local_1140._8_4_ * local_1480._4_4_;
            fVar104 = local_1160._12_4_ * (float)local_13e0._4_4_ +
                      local_1120._12_4_ * fVar85 + local_1140._12_4_ * local_1480._4_4_;
            fVar106 = local_1160._16_4_ * (float)local_13e0._4_4_ +
                      local_1120._16_4_ * fVar85 + local_1140._16_4_ * local_1480._4_4_;
            fVar108 = local_1160._20_4_ * (float)local_13e0._4_4_ +
                      local_1120._20_4_ * fVar85 + local_1140._20_4_ * local_1480._4_4_;
            fVar85 = local_1160._24_4_ * (float)local_13e0._4_4_ +
                     local_1120._24_4_ * fVar85 + local_1140._24_4_ * local_1480._4_4_;
            fVar111 = fVar145 + auVar86._28_4_ + fVar145;
            auVar126._0_4_ = fVar89 + fVar89;
            auVar126._4_4_ = fVar101 + fVar101;
            auVar126._8_4_ = fVar102 + fVar102;
            auVar126._12_4_ = fVar104 + fVar104;
            auVar126._16_4_ = fVar106 + fVar106;
            auVar126._20_4_ = fVar108 + fVar108;
            auVar126._24_4_ = fVar85 + fVar85;
            auVar126._28_4_ = fVar111 + fVar111;
            fVar89 = local_1160._0_4_ * fVar10 + local_1120._0_4_ * fVar2 + local_1140._0_4_ * fVar1
            ;
            fVar101 = local_1160._4_4_ * fVar13 +
                      local_1120._4_4_ * fVar12 + local_1140._4_4_ * fVar11;
            fVar103 = local_1160._8_4_ * fVar107 +
                      local_1120._8_4_ * fVar105 + local_1140._8_4_ * fVar103;
            fVar105 = local_1160._12_4_ * fVar14 +
                      local_1120._12_4_ * fVar110 + local_1140._12_4_ * fVar109;
            fVar107 = local_1160._16_4_ * fVar17 +
                      local_1120._16_4_ * fVar16 + local_1140._16_4_ * fVar15;
            fVar109 = local_1160._20_4_ * fVar20 +
                      local_1120._20_4_ * fVar19 + local_1140._20_4_ * fVar18;
            fVar110 = local_1160._24_4_ * fVar23 +
                      local_1120._24_4_ * fVar22 + local_1140._24_4_ * fVar21;
            fVar145 = fVar145 + fVar111 + fVar145;
            auVar149 = vrcpps_avx(auVar126);
            fVar85 = auVar149._0_4_;
            fVar1 = auVar149._4_4_;
            auVar56._4_4_ = auVar126._4_4_ * fVar1;
            auVar56._0_4_ = auVar126._0_4_ * fVar85;
            fVar2 = auVar149._8_4_;
            auVar56._8_4_ = auVar126._8_4_ * fVar2;
            fVar10 = auVar149._12_4_;
            auVar56._12_4_ = auVar126._12_4_ * fVar10;
            fVar11 = auVar149._16_4_;
            auVar56._16_4_ = auVar126._16_4_ * fVar11;
            fVar12 = auVar149._20_4_;
            auVar56._20_4_ = auVar126._20_4_ * fVar12;
            fVar13 = auVar149._24_4_;
            auVar56._24_4_ = auVar126._24_4_ * fVar13;
            auVar56._28_4_ = auVar25._28_4_;
            auVar137._8_4_ = 0x3f800000;
            auVar137._0_8_ = &DAT_3f8000003f800000;
            auVar137._12_4_ = 0x3f800000;
            auVar137._16_4_ = 0x3f800000;
            auVar137._20_4_ = 0x3f800000;
            auVar137._24_4_ = 0x3f800000;
            auVar137._28_4_ = 0x3f800000;
            auVar149 = vsubps_avx(auVar137,auVar56);
            local_1380._4_4_ = (fVar101 + fVar101) * (fVar1 + fVar1 * auVar149._4_4_);
            local_1380._0_4_ = (fVar89 + fVar89) * (fVar85 + fVar85 * auVar149._0_4_);
            local_1380._8_4_ = (fVar103 + fVar103) * (fVar2 + fVar2 * auVar149._8_4_);
            local_1380._12_4_ = (fVar105 + fVar105) * (fVar10 + fVar10 * auVar149._12_4_);
            local_1380._16_4_ = (fVar107 + fVar107) * (fVar11 + fVar11 * auVar149._16_4_);
            local_1380._20_4_ = (fVar109 + fVar109) * (fVar12 + fVar12 * auVar149._20_4_);
            local_1380._24_4_ = (fVar110 + fVar110) * (fVar13 + fVar13 * auVar149._24_4_);
            local_1380._28_4_ = fVar145 + fVar145;
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar119._4_4_ = uVar84;
            auVar119._0_4_ = uVar84;
            auVar119._8_4_ = uVar84;
            auVar119._12_4_ = uVar84;
            auVar119._16_4_ = uVar84;
            auVar119._20_4_ = uVar84;
            auVar119._24_4_ = uVar84;
            auVar119._28_4_ = uVar84;
            auVar149 = vcmpps_avx(auVar119,local_1380,2);
            uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar132._4_4_ = uVar84;
            auVar132._0_4_ = uVar84;
            auVar132._8_4_ = uVar84;
            auVar132._12_4_ = uVar84;
            auVar132._16_4_ = uVar84;
            auVar132._20_4_ = uVar84;
            auVar132._24_4_ = uVar84;
            auVar132._28_4_ = uVar84;
            auVar86 = vcmpps_avx(local_1380,auVar132,2);
            auVar149 = vandps_avx(auVar86,auVar149);
            auVar95 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
            auVar125 = vpand_avx(auVar95,auVar125);
            auVar95 = vpmovsxwd_avx(auVar125);
            auVar141 = vpshufd_avx(auVar125,0xee);
            auVar141 = vpmovsxwd_avx(auVar141);
            auVar120._16_16_ = auVar141;
            auVar120._0_16_ = auVar95;
            if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar120 >> 0x7f,0) != '\0') ||
                  (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar141 >> 0x3f,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar141[0xf] < '\0') {
              auVar149 = vcmpps_avx(auVar126,_DAT_02020f00,4);
              auVar95 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
              auVar125 = vpand_avx(auVar125,auVar95);
              auVar95 = vpmovsxwd_avx(auVar125);
              auVar125 = vpunpckhwd_avx(auVar125,auVar125);
              local_11e0._16_16_ = auVar125;
              local_11e0._0_16_ = auVar95;
              if ((((((((local_11e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_11e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_11e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_11e0 >> 0x7f,0) != '\0') ||
                    (local_11e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar125 >> 0x3f,0) != '\0') ||
                  (local_11e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar125[0xf] < '\0') {
                auStack_13f0._0_8_ = auVar165._16_8_;
                auStack_13f0._8_8_ = auVar166._24_8_;
                uStack_1250 = auStack_13f0._0_8_;
                uStack_1248 = auStack_13f0._8_8_;
                local_1040._8_8_ = auVar147._8_8_;
                local_1040._16_8_ = auVar148._16_8_;
                local_1040._24_8_ = auVar152._24_8_;
                local_1240 = auVar147._0_8_;
                uStack_1238 = local_1040._8_8_;
                uStack_1230 = local_1040._16_8_;
                uStack_1228 = local_1040._24_8_;
                local_1220 = local_1060;
                local_1200 = &local_1448;
                local_1180 = local_1380;
                pGVar81 = (context->scene->geometries).items[uVar5].ptr;
                if ((pGVar81->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar115._8_4_ = 0x7fffffff;
                  auVar115._0_8_ = 0x7fffffff7fffffff;
                  auVar115._12_4_ = 0x7fffffff;
                  auVar115._16_4_ = 0x7fffffff;
                  auVar115._20_4_ = 0x7fffffff;
                  auVar115._24_4_ = 0x7fffffff;
                  auVar115._28_4_ = 0x7fffffff;
                  auVar149 = vandps_avx(local_1060,auVar115);
                  auVar121._8_4_ = 0x219392ef;
                  auVar121._0_8_ = 0x219392ef219392ef;
                  auVar121._12_4_ = 0x219392ef;
                  auVar121._16_4_ = 0x219392ef;
                  auVar121._20_4_ = 0x219392ef;
                  auVar121._24_4_ = 0x219392ef;
                  auVar121._28_4_ = 0x219392ef;
                  auVar149 = vcmpps_avx(auVar149,auVar121,5);
                  auVar86 = vrcpps_avx(local_1060);
                  fVar85 = auVar86._0_4_;
                  fVar1 = auVar86._4_4_;
                  auVar57._4_4_ = local_1060._4_4_ * fVar1;
                  auVar57._0_4_ = local_1060._0_4_ * fVar85;
                  fVar2 = auVar86._8_4_;
                  auVar57._8_4_ = local_1060._8_4_ * fVar2;
                  fVar10 = auVar86._12_4_;
                  auVar57._12_4_ = local_1060._12_4_ * fVar10;
                  fVar11 = auVar86._16_4_;
                  auVar57._16_4_ = local_1060._16_4_ * fVar11;
                  fVar12 = auVar86._20_4_;
                  auVar57._20_4_ = local_1060._20_4_ * fVar12;
                  fVar13 = auVar86._24_4_;
                  auVar57._24_4_ = local_1060._24_4_ * fVar13;
                  auVar57._28_4_ = local_1060._28_4_;
                  auVar127._8_4_ = 0x3f800000;
                  auVar127._0_8_ = &DAT_3f8000003f800000;
                  auVar127._12_4_ = 0x3f800000;
                  auVar127._16_4_ = 0x3f800000;
                  auVar127._20_4_ = 0x3f800000;
                  auVar127._24_4_ = 0x3f800000;
                  auVar127._28_4_ = 0x3f800000;
                  auVar130 = vsubps_avx(auVar127,auVar57);
                  auVar98._0_4_ = fVar85 + fVar85 * auVar130._0_4_;
                  auVar98._4_4_ = fVar1 + fVar1 * auVar130._4_4_;
                  auVar98._8_4_ = fVar2 + fVar2 * auVar130._8_4_;
                  auVar98._12_4_ = fVar10 + fVar10 * auVar130._12_4_;
                  auVar98._16_4_ = fVar11 + fVar11 * auVar130._16_4_;
                  auVar98._20_4_ = fVar12 + fVar12 * auVar130._20_4_;
                  auVar98._24_4_ = fVar13 + fVar13 * auVar130._24_4_;
                  auVar98._28_4_ = auVar86._28_4_ + auVar130._28_4_;
                  auVar149 = vandps_avx(auVar149,auVar98);
                  auVar58._4_4_ = auVar149._4_4_ * local_1260._4_4_;
                  auVar58._0_4_ = auVar149._0_4_ * local_1260._0_4_;
                  auVar58._8_4_ = auVar149._8_4_ * local_1260._8_4_;
                  auVar58._12_4_ = auVar149._12_4_ * local_1260._12_4_;
                  auVar58._16_4_ = auVar149._16_4_ * auVar165._16_4_;
                  auVar58._20_4_ = auVar149._20_4_ * auVar165._20_4_;
                  auVar58._24_4_ = auVar149._24_4_ * auVar166._24_4_;
                  auVar58._28_4_ = auVar98._28_4_;
                  auVar86 = vminps_avx(auVar58,auVar127);
                  auVar59._4_4_ = auVar149._4_4_ * fVar157;
                  auVar59._0_4_ = auVar149._0_4_ * fVar146;
                  auVar59._8_4_ = auVar149._8_4_ * auVar147._8_4_;
                  auVar59._12_4_ = auVar149._12_4_ * auVar147._12_4_;
                  auVar59._16_4_ = auVar149._16_4_ * auVar148._16_4_;
                  auVar59._20_4_ = auVar149._20_4_ * auVar148._20_4_;
                  auVar59._24_4_ = auVar149._24_4_ * auVar152._24_4_;
                  auVar59._28_4_ = auVar149._28_4_;
                  auVar149 = vminps_avx(auVar59,auVar127);
                  auVar125 = *(undefined1 (*) [16])(local_1448 + local_1440 * 4);
                  auVar95 = auVar125;
                  if (2 < local_1438) {
                    auVar95 = *(undefined1 (*) [16])(local_1448 + local_1440 * 8);
                  }
                  auVar141 = *(undefined1 (*) [16])local_1448;
                  if (local_1440 == 2) {
                    auVar141 = vpshufd_avx(auVar141,0x54);
                    auVar125 = vpshufd_avx(auVar125,0x54);
                    auVar95 = vpshufd_avx(auVar95,0x54);
                  }
                  auVar138._16_16_ = auVar125;
                  auVar138._0_16_ = auVar141;
                  auVar142._16_16_ = auVar95;
                  auVar142._0_16_ = auVar125;
                  auVar130 = vunpcklps_avx(auVar138,auVar142);
                  auVar141 = vpshufd_avx(auVar141,0xa5);
                  auVar112 = vpshufd_avx(auVar125,0xa5);
                  auVar154._16_16_ = auVar112;
                  auVar154._0_16_ = auVar141;
                  auVar125 = vpshufd_avx(auVar125,0x94);
                  auVar95 = vpshufd_avx(auVar95,0x94);
                  auVar167._16_16_ = auVar95;
                  auVar167._0_16_ = auVar125;
                  auVar176._0_16_ = vpsrld_avx(auVar130._0_16_,0x10);
                  auVar180 = vpsrld_avx(auVar130._16_16_,0x10);
                  auVar196._8_4_ = 0xffff;
                  auVar196._0_8_ = 0xffff0000ffff;
                  auVar196._12_4_ = 0xffff;
                  auVar196._16_4_ = 0xffff;
                  auVar196._20_4_ = 0xffff;
                  auVar196._24_4_ = 0xffff;
                  auVar196._28_4_ = 0xffff;
                  auVar130 = vandps_avx(auVar196,auVar130);
                  auVar150 = vcvtdq2ps_avx(auVar130);
                  auVar176._16_16_ = auVar180;
                  auVar25 = vcvtdq2ps_avx(auVar176);
                  auVar133._0_16_ = vpsrld_avx(auVar141,0x10);
                  auVar141 = vpsrld_avx(auVar112,0x10);
                  auVar130 = vandps_avx(auVar154,auVar196);
                  auVar26 = vcvtdq2ps_avx(auVar130);
                  auVar133._16_16_ = auVar141;
                  auVar27 = vcvtdq2ps_avx(auVar133);
                  auVar122._0_16_ = vpsrld_avx(auVar125,0x10);
                  auVar125 = vpsrld_avx(auVar95,0x10);
                  auVar130 = vandps_avx(auVar167,auVar196);
                  auVar130 = vcvtdq2ps_avx(auVar130);
                  auVar122._16_16_ = auVar125;
                  auVar28 = vcvtdq2ps_avx(auVar122);
                  auVar129._8_4_ = 0x3f800000;
                  auVar129._0_8_ = &DAT_3f8000003f800000;
                  auVar129._12_4_ = 0x3f800000;
                  auVar134._16_4_ = 0x3f800000;
                  auVar134._0_16_ = auVar129;
                  auVar134._20_4_ = 0x3f800000;
                  auVar134._24_4_ = 0x3f800000;
                  auVar134._28_4_ = 0x3f800000;
                  auVar29 = vsubps_avx(auVar134,auVar86);
                  auVar29 = vsubps_avx(auVar29,auVar149);
                  local_11c0[1] =
                       auVar149._4_4_ * auVar130._4_4_ * 0.00012207031 +
                       auVar26._4_4_ * 0.00012207031 * auVar86._4_4_ +
                       auVar29._4_4_ * auVar150._4_4_ * 0.00012207031;
                  local_11c0[0] =
                       auVar149._0_4_ * auVar130._0_4_ * 0.00012207031 +
                       auVar26._0_4_ * 0.00012207031 * auVar86._0_4_ +
                       auVar29._0_4_ * auVar150._0_4_ * 0.00012207031;
                  local_11c0[2] =
                       auVar149._8_4_ * auVar130._8_4_ * 0.00012207031 +
                       auVar26._8_4_ * 0.00012207031 * auVar86._8_4_ +
                       auVar29._8_4_ * auVar150._8_4_ * 0.00012207031;
                  local_11c0[3] =
                       auVar149._12_4_ * auVar130._12_4_ * 0.00012207031 +
                       auVar26._12_4_ * 0.00012207031 * auVar86._12_4_ +
                       auVar29._12_4_ * auVar150._12_4_ * 0.00012207031;
                  fStack_11b0 = auVar149._16_4_ * auVar130._16_4_ * 0.00012207031 +
                                auVar26._16_4_ * 0.00012207031 * auVar86._16_4_ +
                                auVar29._16_4_ * auVar150._16_4_ * 0.00012207031;
                  fStack_11ac = auVar149._20_4_ * auVar130._20_4_ * 0.00012207031 +
                                auVar26._20_4_ * 0.00012207031 * auVar86._20_4_ +
                                auVar29._20_4_ * auVar150._20_4_ * 0.00012207031;
                  fStack_11a8 = auVar149._24_4_ * auVar130._24_4_ * 0.00012207031 +
                                auVar26._24_4_ * 0.00012207031 * auVar86._24_4_ +
                                auVar29._24_4_ * auVar150._24_4_ * 0.00012207031;
                  fStack_11a4 = auVar130._28_4_ + 0.0 + auVar149._28_4_;
                  local_11a0[1] =
                       auVar149._4_4_ * auVar28._4_4_ * 0.00012207031 +
                       auVar86._4_4_ * auVar27._4_4_ * 0.00012207031 +
                       auVar25._4_4_ * 0.00012207031 * auVar29._4_4_;
                  local_11a0[0] =
                       auVar149._0_4_ * auVar28._0_4_ * 0.00012207031 +
                       auVar86._0_4_ * auVar27._0_4_ * 0.00012207031 +
                       auVar25._0_4_ * 0.00012207031 * auVar29._0_4_;
                  local_11a0[2] =
                       auVar149._8_4_ * auVar28._8_4_ * 0.00012207031 +
                       auVar86._8_4_ * auVar27._8_4_ * 0.00012207031 +
                       auVar25._8_4_ * 0.00012207031 * auVar29._8_4_;
                  local_11a0[3] =
                       auVar149._12_4_ * auVar28._12_4_ * 0.00012207031 +
                       auVar86._12_4_ * auVar27._12_4_ * 0.00012207031 +
                       auVar25._12_4_ * 0.00012207031 * auVar29._12_4_;
                  fStack_1190 = auVar149._16_4_ * auVar28._16_4_ * 0.00012207031 +
                                auVar86._16_4_ * auVar27._16_4_ * 0.00012207031 +
                                auVar25._16_4_ * 0.00012207031 * auVar29._16_4_;
                  fStack_118c = auVar149._20_4_ * auVar28._20_4_ * 0.00012207031 +
                                auVar86._20_4_ * auVar27._20_4_ * 0.00012207031 +
                                auVar25._20_4_ * 0.00012207031 * auVar29._20_4_;
                  fStack_1188 = auVar149._24_4_ * auVar28._24_4_ * 0.00012207031 +
                                auVar86._24_4_ * auVar27._24_4_ * 0.00012207031 +
                                auVar25._24_4_ * 0.00012207031 * auVar29._24_4_;
                  fStack_1184 = auVar28._28_4_ + auVar27._28_4_ + auVar29._28_4_;
                  auVar88 = ZEXT3264(local_1380);
                  auVar99._8_4_ = 0x7f800000;
                  auVar99._0_8_ = 0x7f8000007f800000;
                  auVar99._12_4_ = 0x7f800000;
                  auVar99._16_4_ = 0x7f800000;
                  auVar99._20_4_ = 0x7f800000;
                  auVar99._24_4_ = 0x7f800000;
                  auVar99._28_4_ = 0x7f800000;
                  auVar149 = vblendvps_avx(auVar99,local_1380,local_11e0);
                  auVar86 = vshufps_avx(auVar149,auVar149,0xb1);
                  auVar86 = vminps_avx(auVar149,auVar86);
                  auVar130 = vshufpd_avx(auVar86,auVar86,5);
                  auVar86 = vminps_avx(auVar86,auVar130);
                  auVar130 = vperm2f128_avx(auVar86,auVar86,1);
                  auVar86 = vminps_avx(auVar86,auVar130);
                  auVar86 = vcmpps_avx(auVar149,auVar86,0);
                  auVar130 = local_11e0 & auVar86;
                  auVar149 = local_11e0;
                  if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar130 >> 0x7f,0) != '\0') ||
                        (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar130 >> 0xbf,0) != '\0') ||
                      (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar130[0x1f] < '\0') {
                    auVar149 = vandps_avx(auVar86,local_11e0);
                  }
                  auVar125 = vpcmpeqd_avx(auVar129,auVar129);
                  auVar139 = ZEXT1664(auVar125);
                  uVar75 = vmovmskps_avx(auVar149);
                  uVar6 = 0;
                  if (uVar75 != 0) {
                    for (; (uVar75 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  uVar72 = (ulong)uVar6;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar81->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar85 = local_11c0[uVar72];
                    fVar1 = local_11a0[uVar72];
                    uVar7 = *(undefined4 *)(local_1160 + uVar72 * 4);
                    uVar84 = *(undefined4 *)(local_1140 + uVar72 * 4);
                    uVar4 = *(undefined4 *)(local_1120 + uVar72 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1180 + uVar72 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar7;
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar84;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar4;
                    *(float *)(ray + k * 4 + 0xf0) = fVar85;
                    *(float *)(ray + k * 4 + 0x100) = fVar1;
                    *(uint *)(ray + k * 4 + 0x110) = uVar76;
                    *(uint *)(ray + k * 4 + 0x120) = uVar5;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    auVar125 = vpshufd_avx(ZEXT416(uVar5),0);
                    _local_13e0 = auVar125;
                    local_1400 = vpshufd_avx(ZEXT416(uVar76),0);
                    auStack_13f0 = auVar166._16_16_;
                    auStack_1330 = auVar87._16_16_;
                    local_1340 = *local_1490;
                    auStack_1358 = auVar100._8_24_;
                    local_1360 = pGVar81;
                    local_1320 = local_11e0;
                    local_1040 = auVar30;
                    local_1000 = auVar135;
                    do {
                      local_13c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_10c0 = local_11c0[uVar72];
                      local_10b0 = local_11a0[uVar72];
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1180 + uVar72 * 4)
                      ;
                      local_1430.context = context->user;
                      uVar84 = *(undefined4 *)(local_1160 + uVar72 * 4);
                      uVar4 = *(undefined4 *)(local_1140 + uVar72 * 4);
                      local_10e0._4_4_ = uVar4;
                      local_10e0._0_4_ = uVar4;
                      local_10e0._8_4_ = uVar4;
                      local_10e0._12_4_ = uVar4;
                      uVar4 = *(undefined4 *)(local_1120 + uVar72 * 4);
                      local_10d0._4_4_ = uVar4;
                      local_10d0._0_4_ = uVar4;
                      local_10d0._8_4_ = uVar4;
                      local_10d0._12_4_ = uVar4;
                      local_10f0[0] = (RTCHitN)(char)uVar84;
                      local_10f0[1] = (RTCHitN)(char)((uint)uVar84 >> 8);
                      local_10f0[2] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
                      local_10f0[3] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
                      local_10f0[4] = (RTCHitN)(char)uVar84;
                      local_10f0[5] = (RTCHitN)(char)((uint)uVar84 >> 8);
                      local_10f0[6] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
                      local_10f0[7] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
                      local_10f0[8] = (RTCHitN)(char)uVar84;
                      local_10f0[9] = (RTCHitN)(char)((uint)uVar84 >> 8);
                      local_10f0[10] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
                      local_10f0[0xb] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
                      local_10f0[0xc] = (RTCHitN)(char)uVar84;
                      local_10f0[0xd] = (RTCHitN)(char)((uint)uVar84 >> 8);
                      local_10f0[0xe] = (RTCHitN)(char)((uint)uVar84 >> 0x10);
                      local_10f0[0xf] = (RTCHitN)(char)((uint)uVar84 >> 0x18);
                      fStack_10bc = local_10c0;
                      fStack_10b8 = local_10c0;
                      fStack_10b4 = local_10c0;
                      fStack_10ac = local_10b0;
                      fStack_10a8 = local_10b0;
                      fStack_10a4 = local_10b0;
                      local_10a0 = local_1400._0_8_;
                      uStack_1098 = local_1400._8_8_;
                      local_1090 = _local_13e0;
                      vcmpps_avx(ZEXT1632(_local_13e0),ZEXT1632(_local_13e0),0xf);
                      uStack_107c = (local_1430.context)->instID[0];
                      local_1080 = uStack_107c;
                      uStack_1078 = uStack_107c;
                      uStack_1074 = uStack_107c;
                      uStack_1070 = (local_1430.context)->instPrimID[0];
                      uStack_106c = uStack_1070;
                      uStack_1068 = uStack_1070;
                      uStack_1064 = uStack_1070;
                      local_14a0 = local_1340._0_8_;
                      uStack_1498 = local_1340._8_8_;
                      local_1430.valid = (int *)&local_14a0;
                      local_1430.geometryUserPtr = pGVar81->userPtr;
                      local_1430.hit = local_10f0;
                      local_1430.N = 4;
                      local_1480 = uVar72;
                      local_1430.ray = (RTCRayN *)ray;
                      if (pGVar81->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar125 = auVar139._0_16_;
                        (*pGVar81->intersectionFilterN)(&local_1430);
                        auVar88 = ZEXT3264(local_1380);
                        auVar125 = vpcmpeqd_avx(auVar125,auVar125);
                        auVar139 = ZEXT1664(auVar125);
                        uVar72 = local_1480;
                        pGVar81 = local_1360;
                      }
                      auVar68._8_8_ = uStack_1498;
                      auVar68._0_8_ = local_14a0;
                      auVar125 = auVar139._0_16_;
                      if (auVar68 == (undefined1  [16])0x0) {
                        auVar95 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar95 = auVar95 ^ auVar125;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar81->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var9)(&local_1430);
                          auVar88 = ZEXT3264(local_1380);
                          auVar125 = vpcmpeqd_avx(auVar125,auVar125);
                          auVar139 = ZEXT1664(auVar125);
                          uVar72 = local_1480;
                          pGVar81 = local_1360;
                        }
                        auVar69._8_8_ = uStack_1498;
                        auVar69._0_8_ = local_14a0;
                        auVar125 = vpcmpeqd_avx(auVar69,_DAT_01feba10);
                        auVar95 = auVar125 ^ auVar139._0_16_;
                        if (auVar69 != (undefined1  [16])0x0) {
                          auVar125 = auVar125 ^ auVar139._0_16_;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])local_1430.hit);
                          *(undefined1 (*) [16])(local_1430.ray + 0xc0) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x10));
                          *(undefined1 (*) [16])(local_1430.ray + 0xd0) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x20));
                          *(undefined1 (*) [16])(local_1430.ray + 0xe0) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x30));
                          *(undefined1 (*) [16])(local_1430.ray + 0xf0) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x40));
                          *(undefined1 (*) [16])(local_1430.ray + 0x100) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x50));
                          *(undefined1 (*) [16])(local_1430.ray + 0x110) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x60));
                          *(undefined1 (*) [16])(local_1430.ray + 0x120) = auVar141;
                          auVar141 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x70));
                          *(undefined1 (*) [16])(local_1430.ray + 0x130) = auVar141;
                          auVar125 = vmaskmovps_avx(auVar125,*(undefined1 (*) [16])
                                                              (local_1430.hit + 0x80));
                          *(undefined1 (*) [16])(local_1430.ray + 0x140) = auVar125;
                        }
                      }
                      auVar96._8_8_ = 0x100000001;
                      auVar96._0_8_ = 0x100000001;
                      if ((auVar96 & auVar95) == (undefined1  [16])0x0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_13c0._0_4_;
                      }
                      *(undefined4 *)(local_1320 + uVar72 * 4) = 0;
                      uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar87._4_4_ = uVar84;
                      auVar87._0_4_ = uVar84;
                      auVar87._8_4_ = uVar84;
                      auVar87._12_4_ = uVar84;
                      auVar87._16_4_ = uVar84;
                      auVar87._20_4_ = uVar84;
                      auVar87._24_4_ = uVar84;
                      auVar87._28_4_ = uVar84;
                      auVar86 = vcmpps_avx(auVar88._0_32_,auVar87,2);
                      auVar149 = vandps_avx(auVar86,local_1320);
                      local_1320 = local_1320 & auVar86;
                      bVar66 = (local_1320 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar67 = (local_1320 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar65 = (local_1320 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                      ;
                      bVar64 = SUB321(local_1320 >> 0x7f,0) != '\0';
                      bVar63 = (local_1320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar62 = SUB321(local_1320 >> 0xbf,0) != '\0';
                      bVar61 = (local_1320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                      ;
                      bVar60 = local_1320[0x1f] < '\0';
                      if (((((((bVar66 || bVar67) || bVar65) || bVar64) || bVar63) || bVar62) ||
                          bVar61) || bVar60) {
                        auVar100._8_4_ = 0x7f800000;
                        auVar100._0_8_ = 0x7f8000007f800000;
                        auVar100._12_4_ = 0x7f800000;
                        auVar100._16_4_ = 0x7f800000;
                        auVar100._20_4_ = 0x7f800000;
                        auVar100._24_4_ = 0x7f800000;
                        auVar100._28_4_ = 0x7f800000;
                        auVar86 = vblendvps_avx(auVar100,auVar88._0_32_,auVar149);
                        auVar130 = vshufps_avx(auVar86,auVar86,0xb1);
                        auVar130 = vminps_avx(auVar86,auVar130);
                        auVar150 = vshufpd_avx(auVar130,auVar130,5);
                        auVar130 = vminps_avx(auVar130,auVar150);
                        auVar150 = vperm2f128_avx(auVar130,auVar130,1);
                        auVar130 = vminps_avx(auVar130,auVar150);
                        auVar130 = vcmpps_avx(auVar86,auVar130,0);
                        auVar150 = auVar149 & auVar130;
                        auVar86 = auVar149;
                        if ((((((((auVar150 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar150 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar150 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar150 >> 0x7f,0) != '\0')
                              || (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar150 >> 0xbf,0) != '\0') ||
                            (auVar150 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar150[0x1f] < '\0') {
                          auVar86 = vandps_avx(auVar130,auVar149);
                        }
                        uVar76 = vmovmskps_avx(auVar86);
                        uVar5 = 0;
                        if (uVar76 != 0) {
                          for (; (uVar76 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                          }
                        }
                        uVar72 = (ulong)uVar5;
                      }
                      local_1320 = auVar149;
                    } while (((((((bVar66 || bVar67) || bVar65) || bVar64) || bVar63) || bVar62) ||
                             bVar61) || bVar60);
                  }
                }
              }
            }
          }
          lVar74 = 0;
          auVar143 = ZEXT1664(local_1270);
          auVar155 = ZEXT1664(local_1280);
          auVar168 = ZEXT1664(local_1290);
          auVar177 = ZEXT1664(local_12a0);
          auVar182 = ZEXT1664(local_12b0);
          auVar197 = ZEXT1664(local_12c0);
          auVar199 = ZEXT1664(local_12d0);
          auVar209 = ZEXT1664(local_12e0);
          auVar229 = ZEXT1664(local_12f0);
          auVar139 = ZEXT1664(local_1390);
        }
        else {
          pGVar73 = (GridSOA *)(uVar72 & 0xfffffffffffffff0);
          lVar74 = *(long *)(pGVar73->data + pGVar73->rootOffset);
          (pre->super_Precalculations).grid = pGVar73;
        }
        uVar84 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar88 = ZEXT1664(CONCAT412(uVar84,CONCAT48(uVar84,CONCAT44(uVar84,uVar84))));
        if (lVar74 != 0) {
          *(long *)*pauVar77 = lVar74;
          *(undefined4 *)(*pauVar77 + 8) = 0;
          pauVar77 = pauVar77 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }